

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O0

int nni_posix_pfd_arm(nni_posix_pfd *pfd,uint events)

{
  uint uVar1;
  int *piVar2;
  undefined1 local_30 [8];
  epoll_event ev;
  int rv;
  nni_posix_pollq *pq;
  uint events_local;
  nni_posix_pfd *pfd_local;
  
  unique0x00012000 = pfd->pq;
  uVar1 = nni_atomic_or(&pfd->events,events);
  memset(local_30,0,0xc);
  local_30._0_4_ = uVar1 | events | 0x40000000;
  unique0x100000f8 = pfd;
  if ((pfd->added & 1U) == 0) {
    ev.data.fd = epoll_ctl(stack0xffffffffffffffe0->epfd,1,pfd->fd,(epoll_event *)local_30);
    if (ev.data.fd == 0) {
      pfd->added = true;
    }
  }
  else {
    ev.data.fd = epoll_ctl(stack0xffffffffffffffe0->epfd,3,pfd->fd,(epoll_event *)local_30);
  }
  if (ev.data.fd != 0) {
    piVar2 = __errno_location();
    ev.data.fd = nni_plat_errno(*piVar2);
  }
  return ev.data.fd;
}

Assistant:

int
nni_posix_pfd_arm(nni_posix_pfd *pfd, unsigned events)
{
	nni_posix_pollq *pq = pfd->pq;
	int              rv;

	// NB: We depend on epoll event flags being the same as their POLLIN
	// equivalents.  I.e. POLLIN == EPOLLIN, POLLOUT == EPOLLOUT, and so
	// forth.  This turns out to be true both for Linux and the illumos
	// epoll implementation.

	struct epoll_event ev;
	events |= nni_atomic_or(&pfd->events, (int) events);

	memset(&ev, 0, sizeof(ev));
	ev.events   = events | EPOLLONESHOT;
	ev.data.ptr = pfd;

	// if this fails the system is probably out of memory - it will fail in
	// arm with ENOENT most likely.
	if (!pfd->added) {
		rv = epoll_ctl(pq->epfd, EPOLL_CTL_ADD, pfd->fd, &ev);
		if (rv == 0) {
			pfd->added = true;
		}
	} else {
		rv = epoll_ctl(pq->epfd, EPOLL_CTL_MOD, pfd->fd, &ev);
	}
	if (rv != 0) {
		rv = nni_plat_errno(errno);
	}
	return (rv);
}